

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi-seq2.c
# Opt level: O2

uint64_t pi_mc(long start,long cnt)

{
  uint64_t uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  lVar2 = 0;
  for (; cnt != 1; cnt = (cnt + 1) / 2) {
    uVar1 = pi_mc(start,cnt / 2);
    start = start + cnt / 2;
    lVar2 = lVar2 + uVar1;
  }
  dVar3 = (double)((seed * 0x41c64e6d + 0x3039) % 0x7fffffff) / 2147483647.0;
  seed = seed * -0x3d5d6597 + 0xd3dc167e;
  dVar4 = (double)(seed % 0x7fffffff) / 2147483647.0;
  return lVar2 + (ulong)(SQRT(dVar3 * dVar3 + dVar4 * dVar4) < 1.0);
}

Assistant:

uint64_t pi_mc(long start, long cnt)
{
    if (cnt == 1) {
        double x = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        double y = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        return sqrt(x*x+y*y) < 1.0 ? 1 : 0;
    }
    return pi_mc(start, cnt/2) + pi_mc(start+cnt/2, (cnt+1)/2);
}